

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O0

void luaH_resize(lua_State *L,Table *t,uint newasize,uint nhsize)

{
  uint oldasize_00;
  Value *pVVar1;
  Value *newarray;
  undefined1 local_50 [4];
  uint oldasize;
  Table newt;
  uint nhsize_local;
  uint newasize_local;
  Table *t_local;
  lua_State *L_local;
  
  oldasize_00 = t->asize;
  newt.gclist._0_4_ = nhsize;
  newt.gclist._4_4_ = newasize;
  if (0x80000000 < newasize) {
    luaG_runerror(L,"table overflow");
  }
  newt.next._2_1_ = 0;
  setnodevector(L,(Table *)local_50,nhsize);
  if (newt.gclist._4_4_ < oldasize_00) {
    exchangehashpart(t,(Table *)local_50);
    reinsertOldSlice(t,oldasize_00,newt.gclist._4_4_);
    exchangehashpart(t,(Table *)local_50);
  }
  pVVar1 = resizearray(L,t,oldasize_00,newt.gclist._4_4_);
  if (pVVar1 == (Value *)0x0 && newt.gclist._4_4_ != 0) {
    freehash(L,(Table *)local_50);
    luaD_throw(L,'\x04');
  }
  exchangehashpart(t,(Table *)local_50);
  t->array = pVVar1;
  t->asize = newt.gclist._4_4_;
  if (pVVar1 != (Value *)0x0) {
    *(uint *)t->array = newt.gclist._4_4_ >> 1;
  }
  clearNewSlice(t,oldasize_00,newt.gclist._4_4_);
  reinserthash(L,(Table *)local_50,t);
  freehash(L,(Table *)local_50);
  return;
}

Assistant:

void luaH_resize (lua_State *L, Table *t, unsigned newasize,
                                          unsigned nhsize) {
  Table newt;  /* to keep the new hash part */
  unsigned oldasize = t->asize;
  Value *newarray;
  if (newasize > MAXASIZE)
    luaG_runerror(L, "table overflow");
  /* create new hash part with appropriate size into 'newt' */
  newt.flags = 0;
  setnodevector(L, &newt, nhsize);
  if (newasize < oldasize) {  /* will array shrink? */
    /* re-insert into the new hash the elements from vanishing slice */
    exchangehashpart(t, &newt);  /* pretend table has new hash */
    reinsertOldSlice(t, oldasize, newasize);
    exchangehashpart(t, &newt);  /* restore old hash (in case of errors) */
  }
  /* allocate new array */
  newarray = resizearray(L, t, oldasize, newasize);
  if (l_unlikely(newarray == NULL && newasize > 0)) {  /* allocation failed? */
    freehash(L, &newt);  /* release new hash part */
    luaM_error(L);  /* raise error (with array unchanged) */
  }
  /* allocation ok; initialize new part of the array */
  exchangehashpart(t, &newt);  /* 't' has the new hash ('newt' has the old) */
  t->array = newarray;  /* set new array part */
  t->asize = newasize;
  if (newarray != NULL)
    *lenhint(t) = newasize / 2u;  /* set an initial hint */
  clearNewSlice(t, oldasize, newasize);
  /* re-insert elements from old hash part into new parts */
  reinserthash(L, &newt, t);  /* 'newt' now has the old hash */
  freehash(L, &newt);  /* free old hash part */
}